

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_suite.cpp
# Opt level: O2

void from_suite::convert_vector_double(void)

{
  vector<double,_std::allocator<double>_> *u;
  long lVar1;
  initializer_list<double> __l;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  iterator iStack_1b8;
  iterator local_1a0;
  variable result;
  iterator local_150;
  iterator local_138;
  vector<double,_std::allocator<double>_> input;
  variable expect;
  type local_d8;
  undefined1 local_b8;
  undefined8 local_a8;
  undefined1 local_88;
  undefined8 local_78;
  undefined1 local_58;
  undefined8 local_48;
  undefined1 local_28;
  
  local_d8._16_8_ = 0x4008000000000000;
  local_d8._24_8_ = 0x4010000000000000;
  local_d8._0_8_ = 0x3ff0000000000000;
  local_d8._8_8_ = 0x4000000000000000;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_d8;
  std::vector<double,_std::allocator<double>_>::vector(&input,__l,(allocator_type *)&result);
  trial::dynamic::convert::
  into<trial::dynamic::basic_variable<std::allocator<char>>,std::vector<double,std::allocator<double>>>
            (&result,(convert *)&input,u);
  local_b8 = 0xd;
  local_d8._0_8_ = 0x3ff0000000000000;
  local_88 = 0xd;
  local_a8 = 0x4000000000000000;
  local_58 = 0xd;
  local_78 = 0x4008000000000000;
  local_28 = 0xd;
  local_48 = 0x4010000000000000;
  init._M_len = 0x4008000000000000;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            (&expect,(basic_array<std::allocator<char>_> *)&local_d8.__align,init);
  lVar1 = 0x90;
  do {
    trial::dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
    ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                    *)((long)&local_d8 + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin(&local_1a0,&result);
  trial::dynamic::basic_variable<std::allocator<char>_>::end(&iStack_1b8,&result);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin(&local_138,&expect);
  trial::dynamic::basic_variable<std::allocator<char>_>::end(&local_150,&expect);
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/std/vector_suite.cpp"
             ,0x28,"void from_suite::convert_vector_double()",&local_1a0,&iStack_1b8,&local_138,
             &local_150);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  ::~small_union(&local_150.
                  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  .current);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  ::~small_union(&local_138.
                  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  .current);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  ::~small_union(&iStack_1b8.
                  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  .current);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  ::~small_union(&local_1a0.
                  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  .current);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&expect.storage);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&result.storage);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&input.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void convert_vector_double()
{
    std::vector<double> input = { 1.0, 2.0, 3.0, 4.0 };
    variable result = convert::into<variable>(input);

    variable expect = array::make({ 1.0, 2.0, 3.0, 4.0 });
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}